

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

bool __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::InstMatcher::TermSpec::isFinal(TermSpec *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (this->t)._content;
  if (this->q != true) {
    if (((uint)uVar3 & 3) == 1) {
      return true;
    }
    if ((uVar3 & 3) == 0) {
      return (bool)((*(byte *)(uVar3 + 0x28) & 8) >> 3);
    }
    return false;
  }
  iVar1 = 0;
  if ((uVar3 & 3) != 0) {
    return false;
  }
  if (*(int *)(uVar3 + 0xc) < 0) {
    iVar1 = 0;
    do {
      uVar3 = *(ulong *)(uVar3 + 0x20);
      if ((uVar3 & 1) != 0) {
        iVar2 = 3;
        goto LAB_003b90ca;
      }
      iVar1 = iVar1 + 2;
    } while (*(int *)(uVar3 + 0xc) < 0);
  }
  iVar2 = *(int *)(uVar3 + 0x20);
LAB_003b90ca:
  return iVar1 + iVar2 == 0;
}

Assistant:

bool isFinal()
        {
          //the fact that a term is shared means it does not contain any special variables
          return q
        ? (t.isTerm() && t.term()->ground())
        : (t.isOrdinaryVar() || (t.isTerm() && t.term()->shared()) );
        }